

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall Interface::Notify(Interface *this,string *sParams)

{
  ostream *poVar1;
  string *sParams_local;
  Interface *this_local;
  
  if (this->m_Protocol == PROTOCOL_XBOARD) {
    poVar1 = std::operator<<(this->m_Out,"# ");
    poVar1 = std::operator<<(poVar1,(string *)sParams);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<(this->m_Out,"info string ");
    poVar1 = std::operator<<(poVar1,(string *)sParams);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

INTERFACE_PROTOTYPE( Notify )
    {
        switch ( m_Protocol )
        {
        case PROTOCOL_XBOARD:
            ( *m_Out ) << "# " << sParams << endl;
            break;

        default:
        case PROTOCOL_UCI:
            ( *m_Out ) << "info string " << sParams << endl;
            break;
        }
    }